

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int ipairsaux(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_Integer lVar3;
  int i;
  lua_State *L_local;
  
  lVar3 = luaL_checkinteger(L,2);
  luaL_checktype(L,1,5);
  iVar1 = (int)lVar3 + 1;
  lua_pushinteger(L,(long)iVar1);
  lua_rawgeti(L,1,iVar1);
  iVar1 = lua_type(L,-1);
  iVar2 = 2;
  if (iVar1 == 0) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int ipairsaux(lua_State*L){
int i=luaL_checkint(L,2);
luaL_checktype(L,1,5);
i++;
lua_pushinteger(L,i);
lua_rawgeti(L,1,i);
return(lua_isnil(L,-1))?0:2;
}